

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

int __thiscall presolve::HPresolve::link(HPresolve *this,char *__from,char *__to)

{
  HighsVarType HVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  HighsInt y;
  long lVar9;
  long lVar10;
  int *piVar11;
  pointer piVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int *piVar16;
  int iVar17;
  int *piVar18;
  int local_48;
  HighsInt Nleft;
  pointer local_40;
  int *local_38;
  
  iVar15 = (int)__from;
  piVar8 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6[iVar15] = piVar5[piVar8[iVar15]];
  piVar12 = (this->Aprev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar12[iVar15] = -1;
  piVar5[piVar8[iVar15]] = iVar15;
  lVar13 = (long)piVar6[iVar15];
  if (lVar13 != -1) {
    piVar12[lVar13] = iVar15;
  }
  piVar11 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + piVar8[iVar15];
  *piVar11 = *piVar11 + 1;
  piVar5 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5[iVar15] = -1;
  piVar6 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar11 = piVar6 + iVar15;
  *piVar11 = -1;
  piVar12 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar7 = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = piVar12[iVar15];
  iVar17 = piVar7[iVar2];
  iVar14 = -1;
  if (iVar17 != -1) {
    iVar3 = piVar8[iVar15];
    piVar16 = &Nleft;
    Nleft = -1;
    piVar18 = &local_48;
    local_48 = -1;
    local_40 = piVar12;
    local_38 = piVar11;
    do {
      lVar13 = (long)iVar17;
      if (iVar3 < piVar8[lVar13]) {
        iVar4 = piVar5[lVar13];
        lVar9 = (long)iVar4;
        if (lVar9 == -1) goto LAB_00300635;
        if (iVar3 < piVar8[lVar9]) {
          piVar5[lVar13] = piVar6[lVar9];
          piVar6[lVar9] = iVar17;
          lVar13 = lVar9;
          iVar17 = iVar4;
          if (piVar5[lVar9] == -1) goto LAB_0030062b;
        }
        *piVar16 = iVar17;
        piVar11 = piVar5 + lVar13;
        piVar16 = piVar11;
      }
      else {
        lVar9 = lVar13;
        if (iVar3 <= piVar8[lVar13]) goto LAB_0030062b;
        iVar4 = piVar6[lVar13];
        lVar10 = (long)iVar4;
        if (lVar10 == -1) goto LAB_0030062b;
        if (piVar8[lVar10] < iVar3) {
          piVar6[lVar13] = piVar5[lVar10];
          piVar5[lVar10] = iVar17;
          lVar13 = lVar10;
          lVar9 = lVar10;
          iVar17 = iVar4;
          if (piVar6[lVar10] == -1) goto LAB_0030062b;
        }
        *piVar18 = iVar17;
        piVar11 = piVar6 + lVar13;
        piVar18 = piVar11;
      }
      iVar17 = *piVar11;
    } while( true );
  }
  piVar5[iVar15] = -1;
LAB_00300693:
  *piVar11 = -1;
  piVar7[iVar2] = iVar15;
  HighsLinearSumBounds::add
            (&this->impliedRowBounds,piVar12[iVar15],piVar8[iVar15],
             (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar15]);
  HighsLinearSumBounds::add
            (&this->impliedDualRowBounds,
             (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar15],
             (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar15],
             (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar15]);
  piVar8 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar11 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + piVar8[iVar15];
  *piVar11 = *piVar11 + 1;
  HVar1 = (this->model->integrality_).
          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start
          [(this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[iVar15]];
  if (HVar1 == kInteger) {
    lVar13 = 0x118;
  }
  else {
    if (HVar1 != kImplicitInteger) goto LAB_00300727;
    lVar13 = 0x130;
  }
  piVar8 = (pointer)(long)piVar8[iVar15];
  piVar11 = (int *)(*(long *)((long)&this->model + lVar13) + (long)piVar8 * 4);
  *piVar11 = *piVar11 + 1;
LAB_00300727:
  return (int)piVar8;
LAB_0030062b:
  iVar14 = piVar5[lVar9];
  lVar13 = lVar9;
LAB_00300635:
  *piVar18 = iVar14;
  *piVar16 = piVar6[lVar13];
  piVar5[lVar13] = local_48;
  piVar6[lVar13] = Nleft;
  piVar7[iVar2] = iVar17;
  piVar12 = local_40;
  if (piVar8[iVar15] < piVar8[lVar13]) {
    piVar5[iVar15] = piVar5[lVar13];
    iVar17 = piVar7[iVar2];
    *local_38 = iVar17;
    piVar11 = piVar5 + iVar17;
  }
  else {
    piVar6[iVar15] = piVar6[lVar13];
    iVar17 = piVar7[iVar2];
    piVar5[iVar15] = iVar17;
    piVar11 = piVar6 + iVar17;
  }
  goto LAB_00300693;
}

Assistant:

void HPresolve::link(HighsInt pos) {
  Anext[pos] = colhead[Acol[pos]];
  Aprev[pos] = -1;
  colhead[Acol[pos]] = pos;
  if (Anext[pos] != -1) Aprev[Anext[pos]] = pos;

  ++colsize[Acol[pos]];

  ARleft[pos] = -1;
  ARright[pos] = -1;
  auto get_row_left = [&](HighsInt pos) -> HighsInt& { return ARleft[pos]; };
  auto get_row_right = [&](HighsInt pos) -> HighsInt& { return ARright[pos]; };
  auto get_row_key = [&](HighsInt pos) { return Acol[pos]; };
  highs_splay_link(pos, rowroot[Arow[pos]], get_row_left, get_row_right,
                   get_row_key);

  impliedRowBounds.add(Arow[pos], Acol[pos], Avalue[pos]);
  impliedDualRowBounds.add(Acol[pos], Arow[pos], Avalue[pos]);
  ++rowsize[Arow[pos]];
  if (model->integrality_[Acol[pos]] == HighsVarType::kInteger)
    ++rowsizeInteger[Arow[pos]];
  else if (model->integrality_[Acol[pos]] == HighsVarType::kImplicitInteger)
    ++rowsizeImplInt[Arow[pos]];
}